

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * matchid(disctx *ctx,int spos,char *v)

{
  expr *peVar1;
  int iVar2;
  matches *pmVar3;
  match *pmVar4;
  
  if (((ctx->line->atomsnum != spos) && (peVar1 = ctx->line->atoms[spos], peVar1->type == EXPR_ID))
     && (iVar2 = strcmp(peVar1->str,v), iVar2 == 0)) {
    pmVar3 = (matches *)calloc(0x10,1);
    pmVar3->mmax = 0x10;
    pmVar4 = (match *)malloc(0xb80);
    pmVar3->m = pmVar4;
    pmVar3->mnum = 1;
    *(undefined8 *)pmVar4 = 0;
    pmVar4->a[0] = 0;
    pmVar4->a[1] = 0;
    pmVar4->m[0] = 0;
    pmVar4->m[1] = 0;
    pmVar4->lpos = spos + 1;
    memset(&pmVar4->field_0x2c,0,0x8c);
    return pmVar3;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *matchid(struct disctx *ctx, int spos, const char *v) {
	if (spos == ctx->line->atomsnum)
		return 0;
	struct expr *e = ctx->line->atoms[spos];
	if (e->type == EXPR_ID && !strcmp(e->str, v))
		return alwaysmatches(spos+1);
	else
		return 0;
}